

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# root.c
# Opt level: O0

gf eval(gf *f,gf a)

{
  gf in0;
  gf in_SI;
  long in_RDI;
  gf r;
  int i;
  undefined2 local_12;
  undefined4 local_10;
  
  local_12 = *(gf *)(in_RDI + 0x80);
  for (local_10 = 0x3f; -1 < local_10; local_10 = local_10 + -1) {
    in0 = gf_mul(local_12,in_SI);
    local_12 = gf_add(in0,*(gf *)(in_RDI + (long)local_10 * 2));
  }
  return local_12;
}

Assistant:

gf eval(gf *f, gf a)
{
	int i;
	gf r;
	
	r = f[ SYS_T ];

	for (i = SYS_T-1; i >= 0; i--)
	{
		r = gf_mul(r, a);
		r = gf_add(r, f[i]);
	}

	return r;
}